

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O0

void __thiscall MTRand::initialize(MTRand *this,uint32 seed)

{
  int local_2c;
  MTRand *pMStack_28;
  int i;
  uint32 *r;
  uint32 *s;
  uint32 seed_local;
  MTRand *this_local;
  
  local_2c = 1;
  r = this->state;
  this->state[0] = seed & 0xffffffff;
  pMStack_28 = this;
  for (; r = r + 1, local_2c < 0x270; local_2c = local_2c + 1) {
    *r = (pMStack_28->state[0] ^ pMStack_28->state[0] >> 0x1e) * 0x6c078965 + (long)local_2c &
         0xffffffff;
    pMStack_28 = (MTRand *)(pMStack_28->state + 1);
  }
  return;
}

Assistant:

void MTRand::initialize(const uint32 seed) {
  // Initialize generator state with seed
  // See Knuth TAOCP Vol 2, 3rd Ed, p.106 for multiplier.
  // In previous versions, most significant bits (MSBs) of the seed affect
  // only MSBs of the state array.  Modified 9 Jan 2002 by Makoto Matsumoto.
  uint32 *s = state;
  uint32 *r = state;
  int i = 1;
  *s++ = seed & 0xffffffffUL;
  for (; i < N; ++i) {
    *s++ = (1812433253UL * (*r ^ (*r >> 30)) + i) & 0xffffffffUL;
    r++;
  }
}